

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_int_Test::TestBody
          (ByteBufferTest_test_read_int_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  ByteBuffer byte_buffer1;
  AssertHelper local_88;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  internal local_68 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer local_38 [48];
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_38,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)local_38);
  local_80.ptr_._0_4_ = 0x1e240;
  local_88.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::CmpHelperEQ<int,int>
            (local_68,"123456","byte_buffer1.ReadInt()",(int *)&local_80,(int *)&local_88);
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (local_80.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_80.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_80.ptr_ + 8))();
      }
      local_80.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)local_68,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)local_68);
  local_88.data_._0_4_ = 0xfffe1dc0;
  local_70.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_80,"-123456","byte_buffer2.ReadInt()",(int *)&local_88,
             (int *)&local_70);
  if (local_80.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_78.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_78.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x82,pcVar2);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_88.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_88.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
      local_88.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_68);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_38);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_int)
{
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteInt(123456);
    EXPECT_EQ(123456, byte_buffer1.ReadInt());

    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteInt(-123456);
    EXPECT_EQ(-123456, byte_buffer2.ReadInt());
}